

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::createBinOp(Builder *this,Op opCode,Id typeId,Id left,Id right)

{
  value_type vVar1;
  value_type vVar2;
  Id resultId;
  reference pvVar3;
  Instruction *this_00;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_70;
  Instruction *local_68;
  Instruction *op;
  allocator<unsigned_int> local_41;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> operands;
  Id right_local;
  Id left_local;
  Id typeId_local;
  Op opCode_local;
  Builder *this_local;
  
  operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = right;
  operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = left;
  if ((this->generatingOpCodeForSpecConst & 1U) == 0) {
    this_00 = (Instruction *)::operator_new(0x60);
    resultId = getUniqueId(this);
    spv::Instruction::Instruction(this_00,resultId,typeId,opCode);
    local_68 = this_00;
    spv::Instruction::reserveOperands(this_00,2);
    spv::Instruction::addIdOperand
              (local_68,operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    spv::Instruction::addIdOperand
              (local_68,(Id)operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_70,
               local_68);
    addInstruction(this,&local_70);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_70);
    this_local._4_4_ = spv::Instruction::getResultId(local_68);
  }
  else {
    std::allocator<unsigned_int>::allocator(&local_41);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,2,&local_41);
    std::allocator<unsigned_int>::~allocator(&local_41);
    vVar2 = operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,0);
    vVar1 = (Id)operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    *pvVar3 = vVar2;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,1);
    *pvVar3 = vVar1;
    memset(&op,0,0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&op);
    this_local._4_4_ =
         createSpecConstantOp
                   (this,opCode,typeId,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&op);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&op);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::createBinOp(Op opCode, Id typeId, Id left, Id right)
{
    // Generate code for spec constants if in spec constant operation
    // generation mode.
    if (generatingOpCodeForSpecConst) {
        std::vector<Id> operands(2);
        operands[0] = left; operands[1] = right;
        return createSpecConstantOp(opCode, typeId, operands, std::vector<Id>());
    }
    Instruction* op = new Instruction(getUniqueId(), typeId, opCode);
    op->reserveOperands(2);
    op->addIdOperand(left);
    op->addIdOperand(right);
    addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}